

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void SetAccessorRange<short>
               (Ref<glTF::Accessor> acc,void *data,uint count,uint numCompsIn,uint numCompsOut)

{
  void *pvVar1;
  double *pdVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  ulong uVar5;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar6;
  Accessor *pAVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,count);
  pvVar6 = acc.vector;
  if (numCompsOut <= numCompsIn) {
    uVar4 = acc._8_8_ & 0xffffffff;
    uVar8 = numCompsOut;
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      local_40 = 1.79769313486232e+308;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&(pvVar6->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar4]->min,&local_40);
      local_40 = -1.79769313486232e+308;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&(pvVar6->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar4]->max,&local_40);
    }
    pvVar1 = (void *)((long)data + (ulong)((int)local_38 * numCompsIn) * 2);
    for (; data < pvVar1; data = (void *)((long)data + (ulong)numCompsIn * 2)) {
      for (uVar5 = 0; numCompsOut != uVar5; uVar5 = uVar5 + 1) {
        dVar10 = (double)(int)*(short *)((long)data + uVar5 * 2);
        pAVar7 = (pvVar6->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
        lVar3 = *(long *)&(pAVar7->min).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        if (dVar10 < *(double *)(lVar3 + uVar5 * 8)) {
          *(double *)(lVar3 + uVar5 * 8) = dVar10;
          pAVar7 = (pvVar6->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)
                   ._M_impl.super__Vector_impl_data._M_start[uVar4];
        }
        lVar3 = *(long *)&(pAVar7->max).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        pdVar2 = (double *)(lVar3 + uVar5 * 8);
        if (*pdVar2 <= dVar10 && dVar10 != *pdVar2) {
          *(double *)(lVar3 + uVar5 * 8) = dVar10;
        }
      }
    }
    return;
  }
  __assert_fail("numCompsOut <= numCompsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFExporter.cpp"
                ,0xb6,
                "void SetAccessorRange(Ref<Accessor>, void *, unsigned int, unsigned int, unsigned int) [T = short]"
               );
}

Assistant:

void SetAccessorRange(Ref<Accessor> acc, void* data, unsigned int count,
	unsigned int numCompsIn, unsigned int numCompsOut)
{
	ai_assert(numCompsOut <= numCompsIn);

	// Allocate and initialize with large values.
	for (unsigned int i = 0 ; i < numCompsOut ; i++) {
		acc->min.push_back( std::numeric_limits<double>::max());
		acc->max.push_back(-std::numeric_limits<double>::max());
	}

	size_t totalComps = count * numCompsIn;
	T* buffer_ptr = static_cast<T*>(data);
	T* buffer_end = buffer_ptr + totalComps;

	// Search and set extreme values.
	for (; buffer_ptr < buffer_end ; buffer_ptr += numCompsIn) {
		for (unsigned int j = 0 ; j < numCompsOut ; j++) {
			double valueTmp = buffer_ptr[j];

			if (valueTmp < acc->min[j]) {
				acc->min[j] = valueTmp;
			}
			if (valueTmp > acc->max[j]) {
				acc->max[j] = valueTmp;
			}
		}
	}
}